

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qassociativeiterable.cpp
# Opt level: O2

const_iterator __thiscall QAssociativeIterable::find(QAssociativeIterable *this,QVariant *key)

{
  void *pvVar1;
  quintptr qVar2;
  QVariant *in_RDX;
  void *extraout_RDX;
  long in_FS_OFFSET;
  const_iterator cVar3;
  QBaseIterator<QMetaAssociation> local_70;
  QBaseIterator<QMetaAssociation> local_60;
  QMetaContainer local_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined8 local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.d_ptr = *(QMetaContainerInterface **)((long)&(key->d).data + 0x10);
  local_48.shared = (PrivateShared *)0x0;
  local_48._8_8_ = 0;
  local_48._16_8_ = 0;
  local_30 = 2;
  local_60.m_iterable.m_pointer.d =
       (QTaggedPointer<QIterable<QMetaAssociation>,_QtPrivate::QConstPreservingPointer<QIterable<QMetaAssociation>,_QIterable<QMetaAssociation>_>::Tag>
        )QMetaAssociation::keyMetaType((QMetaAssociation *)&local_50);
  pvVar1 = QtPrivate::QVariantTypeCoercer::convert
                     ((QVariantTypeCoercer *)&local_48,in_RDX,(QMetaType *)&local_60);
  if (pvVar1 == (void *)0x0) {
    constEnd(this);
  }
  else {
    if ((local_50.d_ptr == (QMetaContainerInterface *)0x0) ||
       (local_50.d_ptr[1].diffIteratorFn == (DiffIteratorFn)0x0)) {
      qVar2 = 0;
    }
    else {
      qVar2 = (*local_50.d_ptr[1].diffIteratorFn)
                        ((void *)(*(ulong *)((long)&(key->d).data + 8) & 0xfffffffffffffffe),pvVar1)
      ;
    }
    local_70.m_iterator = (void *)0x0;
    *(QVariant **)&this->super_QIterable<QMetaAssociation> = key;
    (this->super_QIterable<QMetaAssociation>).m_iterable.m_pointer.d = qVar2;
    local_60.m_iterator = (void *)0x0;
    local_70.m_iterable.m_pointer.d =
         (QTaggedPointer<QIterable<QMetaAssociation>,_QtPrivate::QConstPreservingPointer<QIterable<QMetaAssociation>,_QIterable<QMetaAssociation>_>::Tag>
          )(QTaggedPointer<QIterable<QMetaAssociation>,_QtPrivate::QConstPreservingPointer<QIterable<QMetaAssociation>,_QIterable<QMetaAssociation>_>::Tag>
            )key;
    local_60.m_iterable.m_pointer.d =
         (QTaggedPointer<QIterable<QMetaAssociation>,_QtPrivate::QConstPreservingPointer<QIterable<QMetaAssociation>,_QIterable<QMetaAssociation>_>::Tag>
          )(QTaggedPointer<QIterable<QMetaAssociation>,_QtPrivate::QConstPreservingPointer<QIterable<QMetaAssociation>,_QIterable<QMetaAssociation>_>::Tag>
            )key;
    QBaseIterator<QMetaAssociation>::~QBaseIterator(&local_60);
    QBaseIterator<QMetaAssociation>::~QBaseIterator(&local_70);
  }
  ::QVariant::~QVariant((QVariant *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    cVar3.super_QAssociativeConstIterator.super_QConstIterator<QMetaAssociation>.
    super_QBaseIterator<QMetaAssociation>.m_iterator = extraout_RDX;
    cVar3.super_QAssociativeConstIterator.super_QConstIterator<QMetaAssociation>.
    super_QBaseIterator<QMetaAssociation>.m_iterable.m_pointer.d =
         (QTaggedPointer<QIterable<QMetaAssociation>,_QtPrivate::QConstPreservingPointer<QIterable<QMetaAssociation>,_QIterable<QMetaAssociation>_>::Tag>
          )(QTaggedPointer<QIterable<QMetaAssociation>,_QtPrivate::QConstPreservingPointer<QIterable<QMetaAssociation>,_QIterable<QMetaAssociation>_>::Tag>
            )this;
    return (const_iterator)
           cVar3.super_QAssociativeConstIterator.super_QConstIterator<QMetaAssociation>.
           super_QBaseIterator<QMetaAssociation>;
  }
  __stack_chk_fail();
}

Assistant:

QAssociativeIterable::const_iterator QAssociativeIterable::find(const QVariant &key) const
{
    const QMetaAssociation meta = metaContainer();
    QtPrivate::QVariantTypeCoercer coercer;
    if (const void *keyData = coercer.convert(key, meta.keyMetaType())) {
        return const_iterator(QConstIterator(this, meta.createConstIteratorAtKey(
                                                 constIterable(), keyData)));
    }
    return constEnd();
}